

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::GroupCoins
          (vector<wallet::COutput,_std::allocator<wallet::COutput>_> *available_coins,
          bool subtract_fee_outputs)

{
  OutputGroup *this;
  pointer pCVar1;
  pointer pOVar2;
  int iVar3;
  pointer pCVar4;
  long in_FS_OFFSET;
  undefined1 auStack_48 [16];
  _Storage<long,_true> local_38;
  
  local_38 = (_Storage<long,_true>)((_Storage<long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  if (GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)::
      static_groups == '\0') {
    iVar3 = __cxa_guard_acquire(&GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)
                                 ::static_groups);
    if (iVar3 != 0) {
      GroupCoins::static_groups.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      GroupCoins::static_groups.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      GroupCoins::static_groups.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector,
                   &GroupCoins::static_groups,&__dso_handle);
      __cxa_guard_release(&GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)
                           ::static_groups);
    }
  }
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::clear
            (&GroupCoins::static_groups);
  pCVar1 = (available_coins->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = (available_coins->
                super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)._M_impl.
                super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::emplace_back<>
              (&GroupCoins::static_groups);
    pOVar2 = GroupCoins::static_groups.
             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this = GroupCoins::static_groups.
           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
    std::make_shared<wallet::COutput,wallet::COutput_const&>((COutput *)auStack_48);
    OutputGroup::Insert(this,(shared_ptr<wallet::COutput> *)auStack_48,0,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
    pOVar2[-1].m_subtract_fee_outputs = subtract_fee_outputs;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38._M_value) {
    return &GroupCoins::static_groups;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<OutputGroup>& GroupCoins(const std::vector<COutput>& available_coins, bool subtract_fee_outputs = false)
{
    static std::vector<OutputGroup> static_groups;
    static_groups.clear();
    for (auto& coin : available_coins) {
        static_groups.emplace_back();
        OutputGroup& group = static_groups.back();
        group.Insert(std::make_shared<COutput>(coin), /*ancestors=*/ 0, /*descendants=*/ 0);
        group.m_subtract_fee_outputs = subtract_fee_outputs;
    }
    return static_groups;
}